

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryPool.cpp
# Opt level: O0

void __thiscall psy::C::MemoryPool::~MemoryPool(MemoryPool *this)

{
  char *b;
  int i;
  MemoryPool *this_local;
  
  if (this->blocks_ != (char **)0x0) {
    for (b._4_4_ = 0; b._4_4_ < this->allocatedBlocks_; b._4_4_ = b._4_4_ + 1) {
      if (this->blocks_[b._4_4_] != (char *)0x0) {
        free(this->blocks_[b._4_4_]);
      }
    }
    free(this->blocks_);
  }
  return;
}

Assistant:

MemoryPool::~MemoryPool()
{
    if (blocks_) {
        for (int i = 0; i < allocatedBlocks_; ++i) {
            if (char* b = blocks_[i])
                std::free(b);
        }
        std::free(blocks_);
    }
}